

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyplayer.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  float fVar3;
  uint uVar4;
  char cVar5;
  int iVar6;
  uint uVar7;
  FILE *pFVar8;
  char *__size;
  uchar *puVar9;
  char *pcVar10;
  undefined8 uVar11;
  ulong uVar12;
  uint extraout_EDX;
  char *pcVar13;
  uint uVar14;
  bool bVar15;
  double dVar16;
  uint8_t *converted;
  ssbase base;
  char *local_ac0;
  uint local_ab4;
  uchar *local_ab0 [4];
  undefined1 local_a90 [2656];
  
  puts("Farbrausch Tiny Music Player v0.dontcare TWO");
  puts("Code and Synthesizer (C) 2000-2008 kb/Farbrausch");
  printf("Version: %s\n","0.20250301");
  printf("SDL Port by %s\n\n","https://github.com/jgilje/v2m-player");
  bVar2 = false;
  bVar15 = false;
  bVar1 = false;
  do {
    while( true ) {
      while( true ) {
        while (iVar6 = getopt(argc,argv,"ko:hs:g:f:"), 0x65 < iVar6) {
          switch(iVar6) {
          case 0x66:
            frame_size = atoi(_optarg);
            if (0x3fff < frame_size) {
              frame_size = 0x4000;
            }
            if (frame_size < 0x41) {
              frame_size = 0x40;
            }
            break;
          case 0x67:
            dVar16 = atof(_optarg);
            gain = (float)dVar16;
            break;
          case 0x68:
            bVar15 = true;
            break;
          case 0x6b:
            bVar2 = true;
            break;
          case 0x6f:
            local_ac0 = _optarg;
            bVar1 = true;
            break;
          case 0x73:
            atof(_optarg);
          }
        }
        if (iVar6 != 0x3a) break;
        puts("option needs a value");
      }
      if (iVar6 != 0x3f) break;
      printf("unknown option: %c\n",(ulong)_optopt);
    }
  } while (iVar6 != -1);
  if (bVar15 || argc <= _optind) {
    puts("Usage : v2mplayer [options] input_file_v2m | - (stdin)\n");
    puts("options:");
    puts("          -s N.N  start at position (float, optional, in s., default = 0.0)");
    puts("          -g N.N  gain (float, optional, default = 1.0)");
    puts("          -f N    frame size for SDL (int, optional, default = 1024)");
    puts("          -k      key/auto stop (bool, optional, default = false)");
    puts("          -o str  output v2m newest version (string, optional, default = none)");
    puts("          -h      this help");
    return 1;
  }
  pcVar13 = argv[_optind];
  iVar6 = strcmp(pcVar13,"-");
  pFVar8 = _stdin;
  if (iVar6 == 0) {
    pcVar10 = (char *)0x1000;
    pcVar13 = (char *)0x1000;
    puVar9 = (uchar *)calloc(1,0x1000);
    if (puVar9 == (uchar *)0x0) goto LAB_00102a93;
    iVar6 = getc(pFVar8);
    bVar15 = (char)iVar6 != -1;
    uVar7 = 0;
    uVar14 = 0;
    do {
      uVar4 = 0;
      if (!bVar15) {
        uVar4 = uVar7 + 1;
      }
      uVar7 = uVar4;
      if (pcVar10 == (char *)(ulong)uVar14) {
        pcVar10 = pcVar10 + 0x1000;
        pcVar13 = pcVar10;
        puVar9 = (uchar *)realloc(puVar9,(size_t)pcVar10);
        if (puVar9 == (uchar *)0x0) {
          main_cold_4();
          goto LAB_00102a86;
        }
      }
      puVar9[(long)(ulong)uVar14] = (uchar)iVar6;
      uVar14 = uVar14 + 1;
      iVar6 = getc(_stdin);
      bVar15 = (char)iVar6 != -1;
    } while ((bVar15) || (uVar7 < 0x1000));
    __size = (char *)(ulong)(uVar14 - uVar7);
    printf("Now Playing: stdin(%d[%lu])\n",__size,pcVar10);
    pcVar10 = __size;
LAB_0010278e:
    if (__size != (char *)((ulong)pcVar10 & 0xffffffff)) {
      main_cold_2();
      return 1;
    }
    fclose(pFVar8);
    sdInit();
    if ((puVar9[2] == '\0') && (puVar9[3] == '\0')) {
      iVar6 = CheckV2MVersion(puVar9,(int)pcVar10,(ssbase *)local_a90);
      if (iVar6 < 0) {
        pcVar13 = "Failed to Check Version on input file";
        goto LAB_001027c0;
      }
      pcVar13 = (char *)((ulong)pcVar10 & 0xffffffff);
      ConvertV2M(puVar9,(int)pcVar10,local_ab0,(int *)&local_ab4);
      pcVar10 = (char *)(ulong)local_ab4;
      free(puVar9);
      puVar9 = local_ab0[0];
    }
    else {
      pcVar13 = "No valid input file";
LAB_001027c0:
      SDL_LogCritical(7);
      puVar9 = (uchar *)0x0;
    }
    if (puVar9 != (uchar *)0x0) {
      printf("Convert: %d b\n",(ulong)pcVar10 & 0xffffffff);
      do {
        iVar6 = (int)pcVar10;
        uVar12 = (ulong)pcVar10 & 0xffffffff;
        pcVar10 = (char *)(ulong)(iVar6 - 1);
      } while (puVar9[uVar12] == '\0');
      printf("Strip: %d b\n");
      if (bVar1) {
        pFVar8 = fopen(local_ac0,"a");
        if (pFVar8 == (FILE *)0x0) {
          fprintf(_stderr,"Failed to open %s\n",local_ac0);
        }
        else {
          fwrite(puVar9,1,(ulong)(iVar6 + 1),pFVar8);
          fclose(pFVar8);
        }
        if (pFVar8 == (FILE *)0x0) {
          return (uint)(pFVar8 == (FILE *)0x0);
        }
      }
      player.m_tpc = 1000;
      memset(&player.m_base,0,0x1240);
      V2MPlayer::Open(&player,(uint)puVar9);
      iVar6 = SDL_Init(0x10);
      if (iVar6 < 0) {
        uVar11 = SDL_GetError();
        SDL_Log("Couldn\'t initialize SDL: %s\n",uVar11);
        SDL_Quit();
      }
      else {
        local_a90[6] = 2;
        local_a90._0_4_ = 0xac44;
        local_a90._8_2_ = (undefined2)frame_size;
        local_a90._4_2_ = 0x8120;
        local_a90._16_8_ = sdl_callback;
        iVar6 = SDL_OpenAudioDevice(0,0,local_a90,local_ab0,0);
        if (iVar6 != 0) {
          V2MPlayer::Play(0x105158);
          SDL_PauseAudioDevice(iVar6,0);
          uVar7 = V2MPlayer::Length();
          printf("Length: %d\n",(ulong)uVar7);
          if (bVar2) {
            puts("\n\npress Enter to quit");
            getc(_stdin);
          }
          else {
            cVar5 = V2MPlayer::IsPlaying();
            while (cVar5 != '\0') {
              sleep(1);
              cVar5 = V2MPlayer::IsPlaying();
            }
          }
          SDL_PauseAudioDevice(iVar6,1);
          SDL_Quit();
          V2MPlayer::Close();
          free(puVar9);
          return 0;
        }
        uVar11 = SDL_GetError();
        SDL_Log("Failed to open audio, %s\n",uVar11);
      }
      return 1;
    }
LAB_00102a86:
    main_cold_3();
  }
  else {
    pFVar8 = fopen(pcVar13,"rb");
    if (pFVar8 == (FILE *)0x0) {
      fprintf(_stderr,"Failed to open %s\n",pcVar13);
      return 1;
    }
    fseek(pFVar8,0,2);
    __size = (char *)ftell(pFVar8);
    fseek(pFVar8,0,0);
    printf("Now Playing: %s\n",pcVar13);
    pcVar13 = __size;
    puVar9 = (uchar *)calloc(1,(size_t)__size);
    if (puVar9 != (uchar *)0x0) {
      pcVar10 = (char *)fread(puVar9,1,(size_t)__size,pFVar8);
      goto LAB_0010278e;
    }
  }
  main_cold_1();
LAB_00102a93:
  main_cold_5();
  uVar7 = extraout_EDX + 7;
  if (-1 < (int)extraout_EDX) {
    uVar7 = extraout_EDX;
  }
  uVar12 = V2MPlayer::Render((float *)&player,(uint)pcVar13,SUB41((int)uVar7 >> 3,0));
  fVar3 = gain;
  if (3 < (int)extraout_EDX) {
    uVar12 = 0;
    do {
      *(float *)(pcVar13 + uVar12 * 4) = *(float *)(pcVar13 + uVar12 * 4) * fVar3;
      uVar12 = uVar12 + 1;
    } while (extraout_EDX >> 2 != uVar12);
  }
  return (int)uVar12;
}

Assistant:

int main(int argc, char** argv)
{
    V2mPlayerTitle();
    int opt;
    int startPos = 0;
    int fouts = 0;
    int fkey = 0;
    int fhelp = 0;
    char *foutput;
    while ((opt = getopt(argc, argv, "ko:hs:g:f:")) != -1)
    {
        switch(opt)
        {
            case 'k':
                fkey = 1;
                break;
            case 'o':
                foutput = optarg;
                fouts = 1;
                break;
            case 'h':
                fhelp = 1;
                break;
            case 'g':
                gain = atof(optarg);
                break;
            case 'f':
                frame_size = atoi(optarg);
                frame_size = (frame_size < 64) ? 64 : ((frame_size < 16384) ? frame_size : 16384);
                break;
            case 's':
                startPos = (int)(atof(optarg) * 1000);
                startPos = (startPos < 0) ? 0 : startPos;
                break;
            case ':':
                printf("option needs a value\n");
                break;
            case '?':
                printf("unknown option: %c\n", optopt);
                break;
        }
    }

    if((fhelp > 0)||(optind + 1 > argc))
    {
        V2mPlayerUsage();
        return 1;
    }
    unsigned char* theTune;
    FILE* file;
    uint64_t size;
    unsigned int blksz = 4096, read = 0, eofcnt = 0;
    char ch;
    const char *v2m_filename = argv[optind];
    if (strcmp(v2m_filename, "-") == 0)
    {
        file = stdin;
        eofcnt = 0;
        size = blksz;
        theTune = (unsigned char*) calloc(1, size);
        if (theTune == NULL)
        {
            fprintf(stderr, "Error memory allocator: %Ld b\n", size);
            exit(1);
        }
        ch = getc(stdin);
        while (ch != EOF || eofcnt < blksz)
        {
            if (ch != EOF) {eofcnt = 0;} else {eofcnt++;}
            if (read == size)
            {
                size += blksz;
                theTune = (unsigned char*)realloc(theTune, size * sizeof(unsigned char));
                if (theTune == NULL)
                {
                    fprintf(stderr, "Error memory allocator: %lu b\n", size);
                    exit(1);
                }
            }
            theTune[read] = ch;
            read++;
            ch = getc(stdin);
        }
        read -= eofcnt;

        printf("Now Playing: stdin(%d[%lu])\n", read, size);
        size = read;
    } else {
        file = fopen(v2m_filename, "rb");
        if (file == NULL)
        {
            fprintf(stderr, "Failed to open %s\n", v2m_filename);
            return 1;
        }

        fseek(file, 0, SEEK_END);
        size = ftell(file);
        fseek(file, 0, SEEK_SET);
        printf("Now Playing: %s\n", v2m_filename);
        theTune = (unsigned char*) calloc(1, size);
        if (theTune == NULL)
        {
            fprintf(stderr, "Error memory allocator: %Ld b\n", size);
            exit(1);
        }
        read = fread(theTune, 1, size, file);
    }
    if (size != read)
    {
        fprintf(stderr, "Invalid read size\n");
        return 1;
    }
    fclose(file);
    theTune = check_and_convert(theTune, &read);
    if (theTune == NULL)
    {
        fprintf(stderr, "Error convert to newest\n");
        exit(1);
    }
    printf("Convert: %d b\n", read);
    while (theTune[read--] == 0){}
    read++;
    read++;
    printf("Strip: %d b\n", read);

    if (fouts)
    {
        FILE* fout;
        fout = fopen(foutput, "a");
        if (fout == NULL)
        {
            fprintf(stderr, "Failed to open %s\n", foutput);
            return 1;
        }
        fwrite(theTune, 1, read, fout);
        fclose(fout);
    }

    player.Init();
    player.Open(theTune);

    if (! init_sdl()) {
        return 1;
    }

    player.Play(startPos);
    SDL_PauseAudioDevice(dev, 0);

    printf("Length: %d\n", player.Length());
    if (fkey > 0)
    {
        printf("\n\npress Enter to quit\n");
        getc(stdin);
    } else {
        while(player.IsPlaying()) { sleep(1); }
    }

    SDL_PauseAudioDevice(dev, 1);
    SDL_Quit();
    player.Close();
    free(theTune);
    return 0;
}